

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_test.cpp
# Opt level: O1

ostream * Catch::cerr(void)

{
  int iVar1;
  
  if (cerr()::acs == '\0') {
    cerr();
  }
  if (cerr()::ret == '\0') {
    iVar1 = __cxa_guard_acquire(&cerr()::ret);
    if (iVar1 != 0) {
      std::ostream::ostream(cerr()::ret,&cerr::acs.super_streambuf);
      __cxa_atexit(std::ostream::~ostream,cerr()::ret,&__dso_handle);
      __cxa_guard_release(&cerr()::ret);
    }
  }
  return (ostream *)cerr()::ret;
}

Assistant:

std::ostream& cerr() {
    static ConsoleStream acs(MessageType_Stderr);
    static std::ostream ret(&acs);
    return ret;
}